

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest11InhibitPolicyMapping_::
Section11InvalidSelfIssuedinhibitPolicyMappingTest9<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section11InvalidSelfIssuedinhibitPolicyMappingTest9<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  undefined1 local_e8 [8];
  PkitsTestInfo info;
  char *crls [4];
  char *certs [6];
  Section11InvalidSelfIssuedinhibitPolicyMappingTest9<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  crls[3] = "TrustAnchorRootCertificate";
  crls[1] = "inhibitPolicyMapping1P1subCACRL";
  crls[2] = "inhibitPolicyMapping1P1subsubCACRL";
  info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_var_dwarf_19793f;
  crls[0] = "inhibitPolicyMapping1P1CACRL";
  PkitsTestInfo::PkitsTestInfo((PkitsTestInfo *)local_e8);
  local_e8 = (undefined1  [8])0x6f6640;
  info.time.year._0_1_ = 0;
  PkitsTestInfo::SetUserConstrainedPolicySet((PkitsTestInfo *)local_e8,"");
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<6ul,4ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)this
             ,(char *(*) [6])(crls + 3),
             (char *(*) [4])
             &info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PkitsTestInfo *)local_e8);
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_e8);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest11InhibitPolicyMapping,
                     Section11InvalidSelfIssuedinhibitPolicyMappingTest9) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "inhibitPolicyMapping1P1CACert",
                               "inhibitPolicyMapping1P1SelfIssuedCACert",
                               "inhibitPolicyMapping1P1subCACert",
                               "inhibitPolicyMapping1P1subsubCACert",
                               "InvalidSelfIssuedinhibitPolicyMappingTest9EE"};
  const char* const crls[] = {
      "TrustAnchorRootCRL", "inhibitPolicyMapping1P1CACRL",
      "inhibitPolicyMapping1P1subCACRL", "inhibitPolicyMapping1P1subsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.11.9";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}